

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

int __thiscall
ncnn::NetPrivate::do_forward_layer
          (NetPrivate *this,Layer *layer,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *blob_mats,
          Option *opt)

{
  undefined8 *puVar1;
  NetPrivate *pNVar2;
  pointer pMVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  int iVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  bool bVar14;
  void *pvVar15;
  int iVar16;
  pointer piVar17;
  long lVar18;
  NetPrivate *pNVar19;
  NetPrivate *pNVar20;
  NetPrivate *__ptr;
  pointer pMVar21;
  ulong uVar22;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> top_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs;
  Mat local_c8;
  allocator_type local_79;
  NetPrivate *local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  int local_60;
  NetPrivate *local_58;
  int iStack_50;
  int iStack_4c;
  int iStack_48;
  int iStack_44;
  int iStack_40;
  pointer local_38;
  
  if (layer->one_blob_only != true) {
    pNVar19 = (NetPrivate *)&stack0xffffffffffffff88;
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)pNVar19,
               (long)(layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_c8);
    piVar17 = (layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar17) {
      lVar18 = 0;
      uVar22 = 0;
      do {
        pNVar2 = local_78;
        pMVar21 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start + piVar17[uVar22];
        piVar6 = *(int **)((long)&(local_78->blobs).
                                  super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar18);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            pNVar20 = *(NetPrivate **)((long)&local_78->opt + lVar18);
            pNVar19 = *(NetPrivate **)
                       ((long)&(local_78->layers).
                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar18);
            if (pNVar19 == (NetPrivate *)0x0) {
              if (pNVar20 != (NetPrivate *)0x0) {
                free(pNVar20);
                pNVar19 = pNVar20;
              }
            }
            else {
              (**(code **)&((((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&pNVar19->opt)
                            ->_M_impl).super__Vector_impl_data._M_start)->elempack)();
            }
          }
        }
        puVar1 = (undefined8 *)((long)&pNVar2->opt + lVar18);
        *(undefined8 *)
         ((long)&(pNVar2->input_blob_indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish + lVar18) = 0;
        *(undefined8 *)((long)puVar1 + 0xc) = 0;
        *(undefined8 *)((long)puVar1 + 0x14) = 0;
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)
                 ((long)&(pNVar2->layers).
                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                         super__Vector_impl_data._M_finish + lVar18);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined4 *)
         ((long)&(pNVar2->input_blob_indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar18) = 0;
        if (((opt->lightmode == true) && (layer->support_inplace == true)) &&
           (*pMVar21->refcount != 1)) {
          pNVar19 = (NetPrivate *)&local_c8;
          Mat::clone(&local_c8,(__fn *)pMVar21,opt->blob_allocator,(int)opt,layer);
          pNVar20 = local_78;
          pNVar2 = (NetPrivate *)((long)&local_78->opt + lVar18);
          if (pNVar2 != (NetPrivate *)&local_c8) {
            piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + 1;
              UNLOCK();
            }
            piVar6 = *(int **)((long)&(local_78->blobs).
                                      super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                      _M_impl.super__Vector_impl_data._M_start + lVar18);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                __ptr = *(NetPrivate **)((long)&local_78->opt + lVar18);
                pNVar19 = *(NetPrivate **)
                           ((long)&(local_78->layers).
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar18);
                if (pNVar19 == (NetPrivate *)0x0) {
                  if (__ptr != (NetPrivate *)0x0) {
                    free(__ptr);
                    pNVar19 = __ptr;
                  }
                }
                else {
                  (**(code **)&((((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                 &pNVar19->opt)->_M_impl).super__Vector_impl_data._M_start)->
                               elempack)();
                }
              }
            }
            *(undefined8 *)
             ((long)&(pNVar20->input_blob_indexes).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + lVar18) = 0;
            *(undefined8 *)
             ((long)&(pNVar2->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                     _M_impl.super__Vector_impl_data._M_start + 4) = 0;
            *(undefined8 *)
             ((long)&(pNVar2->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
            pNVar2->opt = (Option *)0x0;
            (pNVar2->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            puVar1 = (undefined8 *)
                     ((long)&(pNVar20->layers).
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish + lVar18);
            *puVar1 = 0;
            puVar1[1] = 0;
            *(undefined4 *)
             ((long)&(pNVar20->input_blob_indexes).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar18) = 0;
            puVar1 = (undefined8 *)((long)&pNVar20->opt + lVar18);
            *puVar1 = local_c8.data;
            puVar1[1] = CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
            *(ulong *)((long)&(pNVar20->blobs).
                              super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                              super__Vector_impl_data._M_finish + lVar18) =
                 CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
            *(int *)((long)&(pNVar20->blobs).
                            super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + lVar18) = local_c8.elempack;
            *(Allocator **)
             ((long)&(pNVar20->layers).
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar18) = local_c8.allocator;
            piVar6 = (int *)((long)&(pNVar20->layers).
                                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + lVar18);
            *piVar6 = local_c8.dims;
            piVar6[1] = local_c8.w;
            piVar6[2] = local_c8.h;
            piVar6[3] = local_c8.d;
            *(int *)((long)&(pNVar20->input_blob_indexes).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar18) = local_c8.c;
            *(size_t *)
             ((long)&(pNVar20->input_blob_indexes).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + lVar18) = local_c8.cstep;
          }
          piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              pNVar19 = (NetPrivate *)local_c8.allocator;
              if ((NetPrivate *)local_c8.allocator == (NetPrivate *)0x0) {
                if ((NetPrivate *)local_c8.data != (NetPrivate *)0x0) {
                  free(local_c8.data);
                  pNVar19 = (NetPrivate *)local_c8.data;
                }
              }
              else {
                (**(code **)&((((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                               &(local_c8.allocator)->_vptr_Allocator)->_M_impl).
                              super__Vector_impl_data._M_start)->elempack)();
              }
            }
          }
          local_c8.cstep = 0;
          local_c8.data = (NetPrivate *)0x0;
          local_c8.refcount._0_4_ = 0;
          local_c8.refcount._4_4_ = 0;
          local_c8.elemsize._0_4_ = 0;
          local_c8.elemsize._4_4_ = 0;
          local_c8.elempack = 0;
          local_c8.dims = 0;
          local_c8.w = 0;
          local_c8.h = 0;
          local_c8.d = 0;
          local_c8.c = 0;
        }
        pNVar2 = local_78;
        if ((*(int *)((long)&(local_78->layers).
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish + lVar18) == 0) &&
           (pMVar3 = (pointer)((long)&local_78->opt + lVar18), pMVar3 != pMVar21)) {
          piVar6 = pMVar21->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          piVar6 = *(int **)((long)&(local_78->blobs).
                                    super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar18);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              pNVar20 = *(NetPrivate **)((long)&local_78->opt + lVar18);
              pNVar19 = *(NetPrivate **)
                         ((long)&(local_78->layers).
                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar18);
              if (pNVar19 == (NetPrivate *)0x0) {
                if (pNVar20 != (NetPrivate *)0x0) {
                  free(pNVar20);
                  pNVar19 = pNVar20;
                }
              }
              else {
                (**(code **)&((((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&pNVar19->opt
                               )->_M_impl).super__Vector_impl_data._M_start)->elempack)();
              }
            }
          }
          puVar1 = (undefined8 *)((long)&pNVar2->opt + lVar18);
          puVar1[8] = 0;
          *(undefined8 *)((long)&pMVar3->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar3->elemsize + 4) = 0;
          pMVar3->data = (void *)0x0;
          pMVar3->refcount = (int *)0x0;
          puVar1[5] = 0;
          puVar1[6] = 0;
          *(undefined4 *)(puVar1 + 7) = 0;
          piVar6 = pMVar21->refcount;
          *puVar1 = pMVar21->data;
          puVar1[1] = piVar6;
          puVar1[2] = pMVar21->elemsize;
          *(int *)(puVar1 + 3) = pMVar21->elempack;
          puVar1[4] = pMVar21->allocator;
          uVar8 = *(undefined8 *)&pMVar21->h;
          puVar1[5] = *(undefined8 *)&pMVar21->dims;
          puVar1[6] = uVar8;
          *(int *)(puVar1 + 7) = pMVar21->c;
          puVar1[8] = pMVar21->cstep;
        }
        convert_layout(pNVar19,(Mat *)((long)&local_78->opt + lVar18),layer,opt);
        uVar22 = uVar22 + 1;
        piVar17 = (layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar18 = lVar18 + 0x48;
      } while (uVar22 < (ulong)((long)(layer->bottoms).super__Vector_base<int,_std::allocator<int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)piVar17 >>
                               2));
    }
    if ((opt->lightmode == false) || (layer->support_inplace != true)) {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_c8,
                 (long)(layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2,&local_79);
      iVar16 = (*layer->_vptr_Layer[6])(layer,&stack0xffffffffffffff88,&local_c8,opt);
      if (iVar16 == 0) {
        piVar17 = (layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish != piVar17) {
          lVar18 = 0;
          uVar22 = 0;
          do {
            pvVar15 = local_c8.data;
            pMVar21 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start + piVar17[uVar22];
            if ((pointer)((long)&(((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                  local_c8.data)->_M_impl).super__Vector_impl_data._M_start + lVar18
                         ) != pMVar21) {
              piVar6 = *(int **)((long)&(((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                         ((long)local_c8.data + 8))->
                                        super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)
                                        ._M_impl.super__Vector_impl_data._M_start + lVar18);
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + 1;
                UNLOCK();
              }
              piVar6 = pMVar21->refcount;
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + -1;
                UNLOCK();
                if (*piVar6 == 0) {
                  if (pMVar21->allocator == (Allocator *)0x0) {
                    if (pMVar21->data != (void *)0x0) {
                      free(pMVar21->data);
                    }
                  }
                  else {
                    (*pMVar21->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              pMVar21->cstep = 0;
              pMVar21->data = (void *)0x0;
              pMVar21->refcount = (int *)0x0;
              *(undefined8 *)((long)&pMVar21->refcount + 4) = 0;
              *(undefined8 *)((long)&pMVar21->elemsize + 4) = 0;
              pMVar21->dims = 0;
              pMVar21->w = 0;
              pMVar21->h = 0;
              pMVar21->d = 0;
              pMVar21->c = 0;
              puVar1 = (undefined8 *)
                       ((long)&(((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)pvVar15)->
                               _M_impl).super__Vector_impl_data._M_start + lVar18);
              piVar6 = (int *)puVar1[1];
              pMVar21->data = (void *)*puVar1;
              pMVar21->refcount = piVar6;
              pMVar21->elemsize =
                   *(size_t *)
                    ((long)&(((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)((long)pvVar15 + 8)
                             )->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl
                            .super__Vector_impl_data._M_finish + lVar18);
              pMVar21->elempack =
                   *(int *)((long)&(((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                    ((long)pvVar15 + 8))->
                                   super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                                   _M_impl.super__Vector_impl_data._M_end_of_storage + lVar18);
              pMVar21->allocator =
                   *(Allocator **)
                    ((long)&(((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             ((long)pvVar15 + 0x20))->
                            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                            _M_impl.super__Vector_impl_data._M_start + lVar18);
              puVar1 = (undefined8 *)
                       ((long)&(((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                ((long)pvVar15 + 0x20))->
                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                               _M_impl.super__Vector_impl_data._M_finish + lVar18);
              uVar8 = *puVar1;
              uVar9 = puVar1[1];
              pMVar21->dims = (int)uVar8;
              pMVar21->w = (int)((ulong)uVar8 >> 0x20);
              pMVar21->h = (int)uVar9;
              pMVar21->d = (int)((ulong)uVar9 >> 0x20);
              pMVar21->c = *(int *)((long)&(((vector<int,_std::allocator<int>_> *)
                                            ((long)pvVar15 + 0x38))->
                                           super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                           super__Vector_impl_data._M_start + lVar18);
              pMVar21->cstep =
                   *(size_t *)
                    ((long)&(((vector<int,_std::allocator<int>_> *)((long)pvVar15 + 0x38))->
                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish + lVar18);
            }
            uVar22 = uVar22 + 1;
            piVar17 = (layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            lVar18 = lVar18 + 0x48;
          } while (uVar22 < (ulong)((long)(layer->tops).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish - (long)piVar17 >> 2));
        }
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                  ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_c8);
        goto LAB_0018b828;
      }
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_c8);
LAB_0018b801:
      bVar14 = false;
    }
    else {
      iVar16 = (*layer->_vptr_Layer[8])(layer,&stack0xffffffffffffff88,opt);
      if (iVar16 != 0) goto LAB_0018b801;
      piVar17 = (layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar17) {
        lVar18 = 0;
        uVar22 = 0;
        do {
          pNVar19 = local_78;
          pMVar21 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start + piVar17[uVar22];
          if ((pointer)((long)&local_78->opt + lVar18) != pMVar21) {
            piVar6 = *(int **)((long)&(local_78->blobs).
                                      super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                      _M_impl.super__Vector_impl_data._M_start + lVar18);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + 1;
              UNLOCK();
            }
            piVar6 = pMVar21->refcount;
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                if (pMVar21->allocator == (Allocator *)0x0) {
                  if (pMVar21->data != (void *)0x0) {
                    free(pMVar21->data);
                  }
                }
                else {
                  (*pMVar21->allocator->_vptr_Allocator[3])();
                }
              }
            }
            pMVar21->cstep = 0;
            pMVar21->data = (void *)0x0;
            pMVar21->refcount = (int *)0x0;
            *(undefined8 *)((long)&pMVar21->refcount + 4) = 0;
            *(undefined8 *)((long)&pMVar21->elemsize + 4) = 0;
            pMVar21->dims = 0;
            pMVar21->w = 0;
            pMVar21->h = 0;
            pMVar21->d = 0;
            pMVar21->c = 0;
            puVar1 = (undefined8 *)((long)&pNVar19->opt + lVar18);
            piVar6 = (int *)puVar1[1];
            pMVar21->data = (void *)*puVar1;
            pMVar21->refcount = piVar6;
            pMVar21->elemsize =
                 *(size_t *)
                  ((long)&(pNVar19->blobs).
                          super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                          super__Vector_impl_data._M_finish + lVar18);
            pMVar21->elempack =
                 *(int *)((long)&(pNVar19->blobs).
                                 super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage + lVar18);
            pMVar21->allocator =
                 *(Allocator **)
                  ((long)&(pNVar19->layers).
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar18);
            piVar6 = (int *)((long)&(pNVar19->layers).
                                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + lVar18);
            iVar4 = piVar6[1];
            iVar5 = piVar6[2];
            iVar7 = piVar6[3];
            pMVar21->dims = *piVar6;
            pMVar21->w = iVar4;
            pMVar21->h = iVar5;
            pMVar21->d = iVar7;
            pMVar21->c = *(int *)((long)&(pNVar19->input_blob_indexes).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start + lVar18);
            pMVar21->cstep =
                 *(size_t *)
                  ((long)&(pNVar19->input_blob_indexes).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish + lVar18);
          }
          uVar22 = uVar22 + 1;
          piVar17 = (layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          lVar18 = lVar18 + 0x48;
        } while (uVar22 < (ulong)((long)(layer->tops).super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_finish - (long)piVar17 >>
                                 2));
      }
LAB_0018b828:
      piVar17 = (layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      bVar14 = true;
      if ((layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar17) {
        uVar22 = 0;
        do {
          if (opt->lightmode == true) {
            pMVar21 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start + piVar17[uVar22];
            piVar6 = pMVar21->refcount;
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                if (pMVar21->allocator == (Allocator *)0x0) {
                  if (pMVar21->data != (void *)0x0) {
                    free(pMVar21->data);
                  }
                }
                else {
                  (*pMVar21->allocator->_vptr_Allocator[3])();
                }
              }
            }
            pMVar21->cstep = 0;
            pMVar21->data = (void *)0x0;
            pMVar21->refcount = (int *)0x0;
            *(undefined8 *)((long)&pMVar21->refcount + 4) = 0;
            *(undefined8 *)((long)&pMVar21->elemsize + 4) = 0;
            pMVar21->dims = 0;
            pMVar21->w = 0;
            pMVar21->h = 0;
            pMVar21->d = 0;
            pMVar21->c = 0;
          }
          uVar22 = uVar22 + 1;
          piVar17 = (layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar22 < (ulong)((long)(layer->bottoms).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)piVar17 >> 2));
      }
    }
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&stack0xffffffffffffff88);
    goto joined_r0x0018b814;
  }
  iVar4 = *(layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar5 = *(layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pMVar21 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start + iVar4;
  local_c8.cstep = 0;
  local_c8.data = (NetPrivate *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8.elemsize._4_4_ = 0;
  local_c8.elempack = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  if (((opt->lightmode == true) && (layer->support_inplace == true)) && (*pMVar21->refcount != 1)) {
    this = (NetPrivate *)&stack0xffffffffffffff88;
    Mat::clone((Mat *)this,(__fn *)pMVar21,opt->blob_allocator,(int)opt,layer);
    piVar6 = (int *)CONCAT44(uStack_6c,uStack_70);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if ((NetPrivate *)local_c8.allocator == (NetPrivate *)0x0) {
          this = (NetPrivate *)local_c8.allocator;
          if ((NetPrivate *)local_c8.data != (NetPrivate *)0x0) {
            free(local_c8.data);
            this = (NetPrivate *)local_c8.data;
          }
        }
        else {
          (**(code **)&((Option *)(local_c8.allocator)->_vptr_Allocator)->openmp_blocktime)();
          this = (NetPrivate *)local_c8.allocator;
        }
      }
    }
    piVar6 = (int *)CONCAT44(uStack_6c,uStack_70);
    local_c8.data = local_78;
    local_c8.refcount._0_4_ = uStack_70;
    local_c8.refcount._4_4_ = uStack_6c;
    local_c8.elemsize._0_4_ = local_68;
    local_c8.elemsize._4_4_ = uStack_64;
    local_c8.elempack = local_60;
    local_c8.allocator = (Allocator *)local_58;
    local_c8.dims = iStack_50;
    local_c8.w = iStack_4c;
    local_c8.h = iStack_48;
    local_c8.d = iStack_44;
    local_c8.c = iStack_40;
    local_c8.cstep = (size_t)local_38;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        this = local_58;
        if (local_58 == (NetPrivate *)0x0) {
          if (local_78 != (NetPrivate *)0x0) {
            free(local_78);
            this = local_78;
          }
        }
        else {
          (**(code **)&local_58->opt->openmp_blocktime)();
        }
      }
    }
    local_38 = (pointer)0x0;
    local_78 = (NetPrivate *)0x0;
    uStack_70 = 0;
    uStack_6c = 0;
    local_68 = 0;
    uStack_64 = 0;
    local_60 = 0;
    iStack_50 = 0;
    iStack_4c = 0;
    iStack_48 = 0;
    iStack_44 = 0;
    iStack_40 = 0;
  }
  if ((local_c8.dims == 0) && (&local_c8 != pMVar21)) {
    piVar6 = pMVar21->refcount;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if ((NetPrivate *)local_c8.allocator == (NetPrivate *)0x0) {
          this = (NetPrivate *)local_c8.allocator;
          if ((NetPrivate *)local_c8.data != (NetPrivate *)0x0) {
            free(local_c8.data);
            this = (NetPrivate *)local_c8.data;
          }
        }
        else {
          (**(code **)&((Option *)(local_c8.allocator)->_vptr_Allocator)->openmp_blocktime)();
          this = (NetPrivate *)local_c8.allocator;
        }
      }
    }
    local_c8.data = pMVar21->data;
    local_c8.refcount._0_4_ = SUB84(pMVar21->refcount,0);
    local_c8.refcount._4_4_ = (undefined4)((ulong)pMVar21->refcount >> 0x20);
    local_c8.elemsize._0_4_ = (undefined4)pMVar21->elemsize;
    local_c8.elemsize._4_4_ = (undefined4)(pMVar21->elemsize >> 0x20);
    local_c8.elempack = pMVar21->elempack;
    local_c8.allocator = pMVar21->allocator;
    uVar10 = pMVar21->dims;
    uVar11 = pMVar21->w;
    uVar12 = pMVar21->h;
    uVar13 = pMVar21->d;
    local_c8.c = pMVar21->c;
    local_c8.cstep = pMVar21->cstep;
    local_c8.dims = uVar10;
    local_c8.w = uVar11;
    local_c8.h = uVar12;
    local_c8.d = uVar13;
  }
  convert_layout(this,&local_c8,layer,opt);
  if ((opt->lightmode == true) && (layer->support_inplace == true)) {
    iVar16 = (*layer->_vptr_Layer[9])(layer,&local_c8,opt);
    if (iVar16 == 0) {
      pMVar21 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start + iVar5;
      if (pMVar21 != &local_c8) {
        piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = pMVar21->refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (pMVar21->allocator == (Allocator *)0x0) {
              if (pMVar21->data != (void *)0x0) {
                free(pMVar21->data);
              }
            }
            else {
              (*pMVar21->allocator->_vptr_Allocator[3])();
            }
          }
        }
        pMVar21->cstep = 0;
        pMVar21->data = (void *)0x0;
        pMVar21->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar21->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar21->elemsize + 4) = 0;
        pMVar21->dims = 0;
        pMVar21->w = 0;
        pMVar21->h = 0;
        pMVar21->d = 0;
        pMVar21->c = 0;
        pMVar21->data = local_c8.data;
        pMVar21->refcount = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
        pMVar21->elemsize = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
        pMVar21->elempack = local_c8.elempack;
        pMVar21->allocator = local_c8.allocator;
        pMVar21->dims = local_c8.dims;
        pMVar21->w = local_c8.w;
        pMVar21->h = local_c8.h;
        pMVar21->d = local_c8.d;
        pMVar21->c = local_c8.c;
        pMVar21->cstep = local_c8.cstep;
      }
      iVar16 = 0;
      goto LAB_0018bdae;
    }
LAB_0018bc2c:
    bVar14 = false;
  }
  else {
    local_38 = (pointer)0x0;
    local_78 = (NetPrivate *)0x0;
    uStack_70 = 0;
    uStack_6c = 0;
    local_68 = 0;
    uStack_64 = 0;
    local_60 = 0;
    local_58 = (NetPrivate *)0x0;
    iStack_50 = 0;
    iStack_4c = 0;
    iStack_48 = 0;
    iStack_44 = 0;
    iStack_40 = 0;
    iVar16 = (*layer->_vptr_Layer[7])(layer,&local_c8,(pointer)&stack0xffffffffffffff88);
    if (iVar16 != 0) {
      piVar6 = (int *)CONCAT44(uStack_6c,uStack_70);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_58 == (NetPrivate *)0x0) {
            if (local_78 != (NetPrivate *)0x0) {
              free(local_78);
            }
          }
          else {
            (**(code **)&local_58->opt->openmp_blocktime)();
          }
        }
      }
      local_38 = (pointer)0x0;
      local_78 = (NetPrivate *)0x0;
      uStack_70 = 0;
      uStack_6c = 0;
      local_68 = 0;
      uStack_64 = 0;
      local_60 = 0;
      iStack_50 = 0;
      iStack_4c = 0;
      iStack_48 = 0;
      iStack_44 = 0;
      iStack_40 = 0;
      goto LAB_0018bc2c;
    }
    pMVar21 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start + iVar5;
    if (pMVar21 != (pointer)&stack0xffffffffffffff88) {
      piVar6 = (int *)CONCAT44(uStack_6c,uStack_70);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      piVar6 = pMVar21->refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (pMVar21->allocator == (Allocator *)0x0) {
            if (pMVar21->data != (void *)0x0) {
              free(pMVar21->data);
            }
          }
          else {
            (*pMVar21->allocator->_vptr_Allocator[3])();
          }
        }
      }
      pMVar21->cstep = 0;
      pMVar21->data = (void *)0x0;
      pMVar21->refcount = (int *)0x0;
      *(undefined8 *)((long)&pMVar21->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar21->elemsize + 4) = 0;
      pMVar21->dims = 0;
      pMVar21->w = 0;
      pMVar21->h = 0;
      pMVar21->d = 0;
      pMVar21->c = 0;
      pMVar21->data = local_78;
      pMVar21->refcount = (int *)CONCAT44(uStack_6c,uStack_70);
      pMVar21->elemsize = CONCAT44(uStack_64,local_68);
      pMVar21->elempack = local_60;
      pMVar21->allocator = (Allocator *)local_58;
      pMVar21->dims = iStack_50;
      pMVar21->w = iStack_4c;
      pMVar21->h = iStack_48;
      pMVar21->d = iStack_44;
      pMVar21->c = iStack_40;
      pMVar21->cstep = (size_t)local_38;
    }
    piVar6 = (int *)CONCAT44(uStack_6c,uStack_70);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_58 == (NetPrivate *)0x0) {
          if (local_78 != (NetPrivate *)0x0) {
            free(local_78);
          }
        }
        else {
          (**(code **)&local_58->opt->openmp_blocktime)();
        }
      }
    }
    local_38 = (pointer)0x0;
    local_78 = (NetPrivate *)0x0;
    uStack_70 = 0;
    uStack_6c = 0;
    local_68 = 0;
    uStack_64 = 0;
    local_60 = 0;
    iStack_50 = 0;
    iStack_4c = 0;
    iStack_48 = 0;
    iStack_44 = 0;
    iStack_40 = 0;
LAB_0018bdae:
    bVar14 = true;
    if (opt->lightmode == true) {
      pMVar21 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start + iVar4;
      piVar6 = pMVar21->refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (pMVar21->allocator == (Allocator *)0x0) {
            if (pMVar21->data != (void *)0x0) {
              free(pMVar21->data);
            }
          }
          else {
            (*pMVar21->allocator->_vptr_Allocator[3])();
          }
        }
      }
      pMVar21->cstep = 0;
      pMVar21->data = (void *)0x0;
      pMVar21->refcount = (int *)0x0;
      *(undefined8 *)((long)&pMVar21->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar21->elemsize + 4) = 0;
      pMVar21->dims = 0;
      pMVar21->w = 0;
      pMVar21->h = 0;
      pMVar21->d = 0;
      pMVar21->c = 0;
    }
  }
  piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if ((NetPrivate *)local_c8.allocator == (NetPrivate *)0x0) {
        if ((NetPrivate *)local_c8.data != (NetPrivate *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (**(code **)&((Option *)(local_c8.allocator)->_vptr_Allocator)->openmp_blocktime)();
      }
    }
  }
joined_r0x0018b814:
  if (bVar14) {
    iVar16 = 0;
  }
  return iVar16;
}

Assistant:

int NetPrivate::do_forward_layer(const Layer* layer, std::vector<Mat>& blob_mats, const Option& opt) const
{
    if (layer->one_blob_only)
    {
        int bottom_blob_index = layer->bottoms[0];
        int top_blob_index = layer->tops[0];

        Mat& bottom_blob_ref = blob_mats[bottom_blob_index];
        Mat bottom_blob;

        if (opt.lightmode)
        {
            // deep copy for inplace forward if data is shared
            if (layer->support_inplace && *bottom_blob_ref.refcount != 1)
            {
                bottom_blob = bottom_blob_ref.clone(opt.blob_allocator);
            }
        }
        if (bottom_blob.dims == 0)
        {
            bottom_blob = bottom_blob_ref;
        }

        convert_layout(bottom_blob, layer, opt);

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            Mat& bottom_top_blob = bottom_blob;
            int ret = layer->forward_inplace(bottom_top_blob, opt);
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = bottom_top_blob;
        }
        else
        {
            Mat top_blob;
            int ret = layer->forward(bottom_blob, top_blob, opt);
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = top_blob;
        }

        if (opt.lightmode)
        {
            // delete after taken in light mode
            blob_mats[bottom_blob_index].release();
        }
    }
    else
    {
        std::vector<Mat> bottom_blobs(layer->bottoms.size());
        for (size_t i = 0; i < layer->bottoms.size(); i++)
        {
            int bottom_blob_index = layer->bottoms[i];

            Mat& bottom_blob_ref = blob_mats[bottom_blob_index];
            bottom_blobs[i].release();

            if (opt.lightmode)
            {
                // deep copy for inplace forward if data is shared
                if (layer->support_inplace && *bottom_blob_ref.refcount != 1)
                {
                    bottom_blobs[i] = bottom_blob_ref.clone(opt.blob_allocator);
                }
            }
            if (bottom_blobs[i].dims == 0)
            {
                bottom_blobs[i] = bottom_blob_ref;
            }

            convert_layout(bottom_blobs[i], layer, opt);
        }

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            std::vector<Mat>& bottom_top_blobs = bottom_blobs;
            int ret = layer->forward_inplace(bottom_top_blobs, opt);
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i = 0; i < layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = bottom_top_blobs[i];
            }
        }
        else
        {
            std::vector<Mat> top_blobs(layer->tops.size());
            int ret = layer->forward(bottom_blobs, top_blobs, opt);
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i = 0; i < layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = top_blobs[i];
            }
        }

        for (size_t i = 0; i < layer->bottoms.size(); i++)
        {
            int bottom_blob_index = layer->bottoms[i];

            if (opt.lightmode)
            {
                // delete after taken in light mode
                blob_mats[bottom_blob_index].release();
            }
        }
    }

    return 0;
}